

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_buffer_pointerv(NegativeTestContext *ctx)

{
  GLvoid *pGVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  void *pvStack_18;
  GLuint buf;
  GLvoid *params;
  NegativeTestContext *ctx_local;
  
  pvStack_18 = (void *)0x0;
  params = ctx;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_1c);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)params,0x8892,local_1c);
  pGVar1 = params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_41);
  NegativeTestContext::beginSection((NegativeTestContext *)pGVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glGetBufferPointerv
            ((CallLogWrapper *)params,0x8892,0xffffffff,&stack0xffffffffffffffe8);
  NegativeTestContext::expectError((NegativeTestContext *)params,0x500);
  glu::CallLogWrapper::glGetBufferPointerv
            ((CallLogWrapper *)params,0xffffffff,0x88bd,&stack0xffffffffffffffe8);
  NegativeTestContext::expectError((NegativeTestContext *)params,0x500);
  NegativeTestContext::endSection((NegativeTestContext *)params);
  pGVar1 = params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target."
             ,&local_79);
  NegativeTestContext::beginSection((NegativeTestContext *)pGVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)params,0x8892,0);
  glu::CallLogWrapper::glGetBufferPointerv
            ((CallLogWrapper *)params,0x8892,0x88bd,&stack0xffffffffffffffe8);
  NegativeTestContext::expectError((NegativeTestContext *)params,0x502);
  NegativeTestContext::endSection((NegativeTestContext *)params);
  glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)params,1,&local_1c);
  return;
}

Assistant:

void get_buffer_pointerv (NegativeTestContext& ctx)
{
	GLvoid*	params	= DE_NULL;
	GLuint	buf;
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, buf);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetBufferPointerv(GL_ARRAY_BUFFER, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetBufferPointerv(-1, GL_BUFFER_MAP_POINTER, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target.");
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &params);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &buf);
}